

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderFrameBorder(ImVec2 p_min,ImVec2 p_max,float rounding)

{
  undefined1 in_ZMM0 [64];
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 in_ZMM1 [64];
  float in_stack_00000010;
  ImDrawCornerFlags in_stack_00000014;
  float in_stack_00000018;
  ImU32 in_stack_0000001c;
  ImVec2 *in_stack_00000020;
  ImVec2 *in_stack_00000028;
  ImDrawList *in_stack_00000030;
  float border_size;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *this;
  ImDrawList *pIVar3;
  ImVec2 local_4c;
  undefined8 local_44;
  ImVec2 local_3c;
  undefined8 local_34;
  float local_2c;
  ImGuiWindow *local_28;
  ImGuiContext *local_20;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_8 = vmovlpd_avx(in_ZMM0._0_16_);
  local_10 = vmovlpd_avx(in_ZMM1._0_16_);
  local_20 = GImGui;
  local_28 = GImGui->CurrentWindow;
  local_2c = (GImGui->Style).FrameBorderSize;
  if (0.0 < local_2c) {
    pIVar3 = local_28->DrawList;
    this = &local_3c;
    ImVec2::ImVec2(this,1.0,1.0);
    auVar1._0_8_ = ::operator+(this,(ImVec2 *)0x1b30cc);
    auVar1._8_56_ = extraout_var;
    local_34 = vmovlpd_avx(auVar1._0_16_);
    ImVec2::ImVec2(&local_4c,1.0,1.0);
    auVar2._0_8_ = ::operator+(this,(ImVec2 *)0x1b30fa);
    auVar2._8_56_ = extraout_var_00;
    local_44 = vmovlpd_avx(auVar2._0_16_);
    GetColorU32((ImGuiCol)((ulong)pIVar3 >> 0x20),SUB84(pIVar3,0));
    ImDrawList::AddRect(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_0000001c,
                        in_stack_00000018,in_stack_00000014,in_stack_00000010);
    GetColorU32((ImGuiCol)((ulong)pIVar3 >> 0x20),SUB84(pIVar3,0));
    ImDrawList::AddRect(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_0000001c,
                        in_stack_00000018,in_stack_00000014,in_stack_00000010);
  }
  return;
}

Assistant:

void ImGui::RenderFrameBorder(ImVec2 p_min, ImVec2 p_max, float rounding)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const float border_size = g.Style.FrameBorderSize;
    if (border_size > 0.0f)
    {
        window->DrawList->AddRect(p_min + ImVec2(1, 1), p_max + ImVec2(1, 1), GetColorU32(ImGuiCol_BorderShadow), rounding, ImDrawCornerFlags_All, border_size);
        window->DrawList->AddRect(p_min, p_max, GetColorU32(ImGuiCol_Border), rounding, ImDrawCornerFlags_All, border_size);
    }
}